

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O2

void __thiscall
duckdb_apache::thrift::protocol::TProtocolDefaults::TProtocolDefaults
          (TProtocolDefaults *this,shared_ptr<duckdb_apache::thrift::transport::TTransport> *ptrans)

{
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_20,
               &ptrans->
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  TProtocol::TProtocol
            (&this->super_TProtocol,
             (shared_ptr<duckdb_apache::thrift::transport::TTransport> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_TProtocol)._vptr_TProtocol = (_func_int **)&PTR__TProtocol_027cc2e0;
  return;
}

Assistant:

TProtocolDefaults(std::shared_ptr<TTransport> ptrans) : TProtocol(ptrans) {}